

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O3

void __thiscall Else::gen(Else *this,int b,int a)

{
  uint i;
  element_type *peVar1;
  element_type *peVar2;
  int iVar3;
  stringstream ss;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  iVar3 = Node::labels;
  i = Node::labels + 2;
  peVar1 = (this->expr).super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Node::labels = i;
  (*(peVar1->super_Node)._vptr_Node[4])(peVar1,0,(ulong)i);
  Node::emitlabel((Node *)this,iVar3 + 1U);
  peVar2 = (this->stmt1).super___shared_ptr<Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar2->super_Node)._vptr_Node[2])(peVar2,(ulong)(iVar3 + 1U),(ulong)(uint)a);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"goto L",6);
  std::ostream::operator<<(local_198,a);
  std::__cxx11::stringbuf::str();
  Node::emit((Node *)this,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  Node::emitlabel((Node *)this,i);
  peVar2 = (this->stmt2).super___shared_ptr<Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar2->super_Node)._vptr_Node[2])(peVar2,(ulong)i,(ulong)(uint)a);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void gen(int b, int a) override {
		std::stringstream ss;
		int label1 = newlabel();
		int label2 = newlabel();
		expr->jumping(0, label2);
		emitlabel(label1);
		stmt1->gen(label1, a);
		ss << "goto L" << a;
		emit(ss.str());
		emitlabel(label2);
		stmt2->gen(label2, a);
	}